

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS
ref_gather_node(REF_NODE ref_node,REF_BOOL swap_endian,REF_INT version,REF_BOOL twod,FILE *file)

{
  undefined8 *puVar1;
  REF_DBL *pRVar2;
  REF_BOOL RVar3;
  FILE *__s;
  uint uVar4;
  REF_STATUS RVar5;
  void *pvVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  REF_STATUS ref_private_macro_code_rxs;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  void *pvVar14;
  long global;
  REF_MPI pRVar15;
  REF_DBL RVar16;
  undefined8 uVar17;
  double dVar18;
  REF_BOOL node_not_used_once;
  REF_INT local;
  REF_BOOL local_b0;
  REF_BOOL local_ac;
  REF_NODE local_a8;
  ulong local_a0;
  ulong local_98;
  void *local_90;
  REF_MPI local_88;
  ulong local_80;
  uint local_78;
  uint local_74;
  REF_BOOL local_70;
  int local_6c;
  long local_68;
  ulong local_60;
  ulong local_58;
  void *local_50;
  ulong local_48;
  FILE *local_40;
  ulong local_38;
  
  pRVar15 = ref_node->ref_mpi;
  local_b0 = 0;
  lVar11 = ref_node->old_n_global;
  uVar4 = (int)(lVar11 / (long)pRVar15->n) + 1;
  uVar9 = 0x7fffffff;
  if (0 < pRVar15->reduce_byte_limit) {
    uVar9 = (ulong)((uint)pRVar15->reduce_byte_limit >> 5);
  }
  local_a8 = ref_node;
  local_70 = twod;
  if (((int)uVar4 < (int)uVar9) && (uVar9 = (ulong)uVar4, (int)uVar4 < 0)) {
    pcVar10 = "malloc local_xyzm of REF_DBL negative";
    uVar17 = 0x4ba;
LAB_00144515:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar17
           ,"ref_gather_node",pcVar10);
LAB_0014461c:
    RVar5 = 1;
  }
  else {
    local_98 = (ulong)(uint)((int)uVar9 * 4);
    sVar8 = local_98 * 8;
    local_ac = swap_endian;
    local_60 = uVar9;
    pvVar6 = malloc(sVar8);
    if (pvVar6 == (void *)0x0) {
      pcVar10 = "malloc local_xyzm of REF_DBL NULL";
      uVar17 = 0x4ba;
    }
    else {
      local_90 = malloc(sVar8);
      if (local_90 != (void *)0x0) {
        if (0 < lVar11) {
          local_48 = local_60 & 0xffffffff;
          local_78 = version - 1;
          uVar9 = local_98 & 0xffffffff;
          if ((int)local_98 < 2) {
            uVar9 = 1;
          }
          local_98 = uVar9 << 3;
          global = 0;
          local_88 = pRVar15;
          local_50 = pvVar6;
          local_40 = (FILE *)file;
          local_38 = (ulong)(uint)version;
          do {
            pvVar6 = local_50;
            uVar9 = lVar11 - global;
            if ((long)local_48 < lVar11 - global) {
              uVar9 = local_60;
            }
            uVar12 = uVar9 & 0xffffffff;
            if ((int)local_60 != 0) {
              memset(local_50,0,local_98);
            }
            local_a0 = uVar12;
            local_68 = global;
            local_58 = uVar12;
            if (0 < (int)uVar9) {
              lVar11 = 0;
              lVar13 = 0;
              do {
                uVar4 = ref_node_local(local_a8,global,&local_6c);
                if ((uVar4 != 0) && (uVar4 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x4ca,"ref_gather_node",(ulong)uVar4,"node local failed");
                  local_74 = uVar4;
                }
                if (uVar4 == 5) {
LAB_0014424b:
                  puVar1 = (undefined8 *)((long)pvVar6 + lVar11 * 8);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  RVar16 = 0.0;
                  uVar17 = 0;
                  lVar7 = lVar11;
                }
                else {
                  if (uVar4 != 0) {
                    return local_74;
                  }
                  lVar7 = (long)local_6c;
                  if (local_88->id != local_a8->part[lVar7]) goto LAB_0014424b;
                  pRVar2 = local_a8->real;
                  *(REF_DBL *)((long)pvVar6 + lVar11 * 8) = pRVar2[lVar7 * 0xf];
                  *(REF_DBL *)((long)pvVar6 + lVar11 * 8 + 8) = pRVar2[lVar7 * 0xf + 1];
                  RVar16 = pRVar2[lVar7 * 0xf + 2];
                  uVar17 = 0x3ff0000000000000;
                  lVar7 = lVar13 * 4;
                }
                *(REF_DBL *)((long)pvVar6 + lVar7 * 8 + 0x10) = RVar16;
                *(undefined8 *)((long)pvVar6 + lVar7 * 8 + 0x18) = uVar17;
                lVar13 = lVar13 + 1;
                global = global + 1;
                lVar11 = lVar11 + 4;
              } while (uVar12 * 4 - lVar11 != 0);
            }
            pRVar15 = local_88;
            pvVar14 = local_90;
            uVar4 = ref_mpi_sum(local_88,pvVar6,local_90,(int)local_a0 * 4,3);
            __s = local_40;
            if (uVar4 != 0) {
              pcVar10 = "sum";
              uVar17 = 0x4d9;
              goto LAB_00144490;
            }
            if ((pRVar15->id == 0) && (0 < (int)local_a0)) {
              local_58 = local_58 << 5;
              uVar9 = 0;
              lVar11 = local_68;
              do {
                dVar18 = *(double *)((long)pvVar14 + uVar9 + 0x18) + -1.0;
                if (dVar18 <= -dVar18) {
                  dVar18 = -dVar18;
                }
                if (0.1 < dVar18) {
                  printf("error gather node %ld %f\n",lVar11);
                  local_b0 = 1;
                }
                RVar3 = local_ac;
                uVar12 = *(ulong *)((long)pvVar14 + uVar9);
                local_80 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                           (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                           (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                           (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
                if (local_ac == 0) {
                  local_80 = uVar12;
                }
                sVar8 = fwrite(&local_80,8,1,__s);
                if (sVar8 != 1) {
                  pcVar10 = "x";
                  uVar17 = 0x4e4;
LAB_00144615:
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,uVar17,"ref_gather_node",pcVar10,1,sVar8);
                  goto LAB_0014461c;
                }
                uVar12 = *(ulong *)((long)pvVar14 + uVar9 + 8);
                local_80 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                           (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                           (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                           (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
                if (RVar3 == 0) {
                  local_80 = uVar12;
                }
                sVar8 = fwrite(&local_80,8,1,__s);
                pvVar14 = local_90;
                if (sVar8 != 1) {
                  pcVar10 = "y";
                  uVar17 = 0x4e7;
                  goto LAB_00144615;
                }
                if (local_70 == 0) {
                  uVar12 = *(ulong *)((long)local_90 + uVar9 + 0x10);
                  local_80 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                             (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                             (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                             (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
                  if (local_ac == 0) {
                    local_80 = uVar12;
                  }
                  sVar8 = fwrite(&local_80,8,1,__s);
                  if (sVar8 != 1) {
                    pcVar10 = "z";
                    uVar17 = 0x4eb;
                    goto LAB_00144615;
                  }
                }
                if ((local_78 < 4) &&
                   (RVar5 = ref_gather_meshb_int((FILE *)__s,(REF_INT)local_38,1), RVar5 != 0)) {
                  pcVar10 = "nnode";
                  uVar4 = 1;
                  uVar17 = 0x4ef;
                  uVar9 = 1;
                  goto LAB_00144493;
                }
                uVar9 = uVar9 + 0x20;
                lVar11 = lVar11 + 1;
              } while (local_58 != uVar9);
            }
            global = local_68 + (int)local_a0;
            lVar11 = local_a8->old_n_global;
            pvVar6 = local_50;
            pRVar15 = local_88;
          } while (global < lVar11);
        }
        free(local_90);
        free(pvVar6);
        uVar4 = ref_mpi_all_or(pRVar15,&local_b0);
        if (uVar4 != 0) {
          pcVar10 = "all gather error code";
          uVar17 = 0x4f6;
LAB_00144490:
          uVar9 = (ulong)uVar4;
LAB_00144493:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar17,"ref_gather_node",uVar9,pcVar10);
          return uVar4;
        }
        if (local_b0 == 0) {
          return 0;
        }
        pcVar10 = "node used more or less than once";
        uVar17 = 0x4f7;
        goto LAB_00144515;
      }
      pcVar10 = "malloc xyzm of REF_DBL NULL";
      uVar17 = 0x4bb;
      local_90 = (void *)0x0;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar17
           ,"ref_gather_node",pcVar10);
    RVar5 = 2;
  }
  return RVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node(REF_NODE ref_node,
                                          REF_BOOL swap_endian, REF_INT version,
                                          REF_BOOL twod, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_DBL swapped_dbl;
  REF_GLOB nnode_written, first, global;
  REF_INT n, i;
  REF_INT local;
  REF_STATUS status;
  REF_BOOL node_not_used_once = REF_FALSE;

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk = MIN(
      chunk, ref_mpi_reduce_chunk_limit(ref_mpi, 4 * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, 4 * chunk, REF_DBL);
  ref_malloc(xyzm, 4 * chunk, REF_DBL);

  nnode_written = 0;
  while (nnode_written < ref_node_n_global(ref_node)) {
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk,
                     ref_node_n_global(ref_node) - nnode_written);

    nnode_written += n;

    for (i = 0; i < 4 * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_node_local(ref_node, global, &local);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status &&
          ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
        local_xyzm[0 + 4 * i] = ref_node_xyz(ref_node, 0, local);
        local_xyzm[1 + 4 * i] = ref_node_xyz(ref_node, 1, local);
        local_xyzm[2 + 4 * i] = ref_node_xyz(ref_node, 2, local);
        local_xyzm[3 + 4 * i] = 1.0;
      } else {
        local_xyzm[0 + 4 * i] = 0.0;
        local_xyzm[1 + 4 * i] = 0.0;
        local_xyzm[2 + 4 * i] = 0.0;
        local_xyzm[3 + 4 * i] = 0.0;
      }
    }

    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, 4 * n, REF_DBL_TYPE), "sum");

    if (ref_mpi_once(ref_mpi))
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[3 + 4 * i] - 1.0) > 0.1) {
          printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                 xyzm[3 + 4 * i]);
          node_not_used_once = REF_TRUE;
        }
        swapped_dbl = xyzm[0 + 4 * i];
        if (swap_endian) SWAP_DBL(swapped_dbl);
        REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "x");
        swapped_dbl = xyzm[1 + 4 * i];
        if (swap_endian) SWAP_DBL(swapped_dbl);
        REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "y");
        if (!twod) {
          swapped_dbl = xyzm[2 + 4 * i];
          if (swap_endian) SWAP_DBL(swapped_dbl);
          REIS(1, fwrite(&swapped_dbl, sizeof(REF_DBL), 1, file), "z");
        }
        if (1 <= version && version <= 4)
          RSS(ref_gather_meshb_int(file, version, REF_EXPORT_MESHB_VERTEX_ID),
              "nnode");
      }
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  RSS(ref_mpi_all_or(ref_mpi, &node_not_used_once), "all gather error code");
  RAS(!node_not_used_once, "node used more or less than once");

  return REF_SUCCESS;
}